

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O0

list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
imrt::Station::increaseIntensity_abi_cxx11_(Station *this,int beam,double intensity,int ratio)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pair<int,_int> pVar4;
  int *piVar5;
  double *pdVar6;
  int in_ECX;
  long in_RSI;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *in_RDI;
  double in_XMM0_Qa;
  int i;
  int j;
  int x;
  pair<int,_int> p;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *diff;
  undefined8 in_stack_ffffffffffffff50;
  Station *in_stack_ffffffffffffff58;
  int iVar7;
  int iVar8;
  int x_00;
  undefined4 in_stack_ffffffffffffffc4;
  int local_30;
  int iStack_2c;
  double local_20;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::list
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x135e45);
  pVar4 = getPos(in_stack_ffffffffffffff58,iVar3);
  local_30 = pVar4.first;
  iStack_2c = pVar4.second;
  iVar1 = local_30 - in_ECX;
  iVar8 = 0;
  piVar5 = std::max<int>((int *)&stack0xffffffffffffffb4,(int *)&stack0xffffffffffffffb0);
  iVar3 = *piVar5;
  local_20 = in_XMM0_Qa;
  while( true ) {
    iVar7 = local_30 + 1 + in_ECX;
    x_00 = iVar3;
    iVar2 = Collimator::getXdim(*(Collimator **)(in_RSI + 0xb0));
    piVar5 = std::min<int>((int *)&stack0xffffffffffffffac,(int *)&stack0xffffffffffffffa8);
    if (*piVar5 <= iVar3) break;
    pdVar6 = maths::Matrix::operator()((Matrix *)(in_RSI + 0xb8),x_00,iStack_2c);
    if ((*pdVar6 != -1.0) || (NAN(*pdVar6))) {
      pdVar6 = maths::Matrix::operator()((Matrix *)(in_RSI + 0xb8),x_00,iStack_2c);
      if (*(int *)(in_RSI + 0x44) < (int)*pdVar6 + (int)local_20) {
        local_20 = (double)*(int *)(in_RSI + 0x44);
        pdVar6 = maths::Matrix::operator()((Matrix *)(in_RSI + 0xb8),x_00,iStack_2c);
        local_20 = local_20 - *pdVar6;
      }
      pdVar6 = maths::Matrix::operator()((Matrix *)(in_RSI + 0xb8),x_00,iStack_2c);
      if (*pdVar6 < -local_20) {
        pdVar6 = maths::Matrix::operator()((Matrix *)(in_RSI + 0xb8),x_00,iStack_2c);
        local_20 = -*pdVar6;
      }
      maths::Matrix::operator()((Matrix *)(in_RSI + 0xb8),x_00,iStack_2c);
      change_intensity((Station *)CONCAT44(in_stack_ffffffffffffffc4,local_30),iStack_2c,x_00,
                       (double)CONCAT44(iVar1,iVar8),
                       (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                       CONCAT44(iVar7,iVar2));
    }
    iVar3 = x_00 + 1;
  }
  return in_RDI;
}

Assistant:

list< pair< int, double > > Station::increaseIntensity(int beam, double intensity, int ratio){
	list< pair< int, double > > diff;
    pair<int,int> p = getPos(beam);
    int x=p.first, j=p.second;
    for(int i=max(x-ratio,0); i<min(x+ratio+1,collimator.getXdim()); i++){
      //for(int j=max(y-ratio,0); j<min(y+ratio+1,collimator.getYdim()); j++){
    	  if(I(i,j)==-1) continue;
        if((int) I(i,j)+ (int) intensity > (int) max_intensity) intensity=max_intensity-I(i,j);
        if(I(i,j)<-intensity) intensity=-I(i,j);
        change_intensity(i, j, I(i,j)+intensity, &diff);
      //}
    }
    return diff;
  }